

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<long_double>::MultAdd
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *y,
          TPZFMatrix<long_double> *z,longdouble alpha,longdouble beta,int opt)

{
  long lVar1;
  longdouble *plVar2;
  long lVar3;
  long lVar4;
  long col;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar5;
  longdouble in_ST6;
  longdouble local_88;
  long local_70;
  long local_68;
  longdouble local_60;
  longdouble local_54;
  longdouble local_48;
  
  local_60 = alpha;
  if (opt == 0) {
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 == (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) goto LAB_00cfaa0c;
  }
  else {
    lVar1 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
LAB_00cfaa0c:
    if ((this->super_TPZBaseMatrix).fRow == lVar1) goto LAB_00cfaa21;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00cfaa21:
  lVar1 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  if ((lVar1 != (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    lVar1 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  }
  lVar3 = (this->super_TPZBaseMatrix).fRow;
  lVar4 = (this->super_TPZBaseMatrix).fCol;
  PrepareZ(this,y,z,beta,opt);
  local_88 = (longdouble)0;
  col = 0;
  local_68 = lVar4;
  if (lVar4 < 1) {
    local_68 = col;
  }
  local_70 = lVar3;
  if (lVar3 < 1) {
    local_70 = col;
  }
  if (lVar1 < 1) {
    lVar1 = col;
  }
  for (; col != lVar1; col = col + 1) {
    if (opt == 0) {
      for (lVar3 = 0; lVar3 != local_68; lVar3 = lVar3 + 1) {
        for (lVar4 = 0; local_70 != lVar4; lVar4 = lVar4 + 1) {
          plVar2 = TPZFMatrix<long_double>::operator()(z,lVar4,col);
          lVar5 = *plVar2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar3);
          local_54 = local_60 * in_ST0;
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = in_ST6;
          (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(x,lVar3,col);
          local_88 = lVar5 + local_54 * in_ST1;
          lVar5 = in_ST6;
          (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(z,lVar4,col,&local_88);
          in_ST1 = in_ST3;
          in_ST3 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = lVar5;
        }
      }
    }
    else {
      for (lVar3 = 0; lVar3 != local_70; lVar3 = lVar3 + 1) {
        local_88 = (longdouble)0;
        for (lVar4 = 0; local_68 != lVar4; lVar4 = lVar4 + 1) {
          lVar5 = in_ST5;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar3);
          (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(x,lVar4,col);
          local_88 = local_88 + in_ST0 * in_ST1;
          in_ST0 = in_ST2;
          in_ST1 = in_ST3;
          in_ST2 = in_ST4;
          in_ST3 = in_ST5;
          in_ST4 = lVar5;
          in_ST5 = lVar5;
        }
        local_48 = local_60 * local_88;
        in_ST6 = in_ST5;
        (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(z,lVar3,col,&local_48);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}